

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O3

xpath_variable * __thiscall
pugi::xpath_variable_set::add(xpath_variable_set *this,char_t *name,xpath_value_type type)

{
  bool bVar1;
  byte *pbVar2;
  char_t *src;
  xpath_variable *pxVar3;
  uint uVar4;
  byte bVar5;
  
  bVar5 = *name;
  if (bVar5 == 0) {
    uVar4 = 0;
  }
  else {
    pbVar2 = name + 1;
    uVar4 = 0;
    do {
      uVar4 = (bVar5 + uVar4) * 0x401;
      bVar5 = *pbVar2;
      pbVar2 = pbVar2 + 1;
      uVar4 = uVar4 >> 6 ^ uVar4;
    } while (bVar5 != 0);
    uVar4 = uVar4 * 9;
  }
  uVar4 = (uVar4 >> 0xb ^ uVar4) & 0x3f;
  pxVar3 = this->_data[uVar4];
  while( true ) {
    if (pxVar3 == (xpath_variable *)0x0) {
      pxVar3 = impl::anon_unknown_0::new_xpath_variable(type,name);
      if (pxVar3 == (xpath_variable *)0x0) {
        pxVar3 = (xpath_variable *)0x0;
      }
      else {
        pxVar3->_next = this->_data[uVar4];
        this->_data[uVar4] = pxVar3;
      }
      return pxVar3;
    }
    src = xpath_variable::name(pxVar3);
    bVar1 = impl::anon_unknown_0::strequal(src,name);
    if (bVar1) break;
    pxVar3 = pxVar3->_next;
  }
  if (pxVar3->_type != type) {
    return (xpath_variable *)0x0;
  }
  return pxVar3;
}

Assistant:

PUGI__FN xpath_variable* xpath_variable_set::add(const char_t* name, xpath_value_type type)
	{
		const size_t hash_size = sizeof(_data) / sizeof(_data[0]);
		size_t hash = impl::hash_string(name) % hash_size;

		// look for existing variable
		for (xpath_variable* var = _data[hash]; var; var = var->_next)
			if (impl::strequal(var->name(), name))
				return var->type() == type ? var : 0;

		// add new variable
		xpath_variable* result = impl::new_xpath_variable(type, name);

		if (result)
		{
			result->_next = _data[hash];

			_data[hash] = result;
		}

		return result;
	}